

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int separatorMoveHelper(QList<QLayoutStruct> *list,int index,int delta,int sep)

{
  int iVar1;
  QLayoutStruct *pQVar2;
  pointer pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  int local_40;
  
  lVar8 = (list->d).size;
  if (lVar8 != 0) {
    pQVar2 = (list->d).ptr;
    lVar12 = 0;
    do {
      if ((&pQVar2->empty)[lVar12] == false) {
        local_40 = *(int *)((long)&pQVar2->pos + lVar12);
        if (local_40 == -1) {
          return 0;
        }
        if (0 < delta) {
          if (index < 0) goto LAB_003efdc3;
          pQVar2 = (list->d).ptr;
          uVar15 = (ulong)(uint)index;
          lVar8 = 0;
          iVar11 = 0;
          goto LAB_003efd75;
        }
        if (-1 < delta) goto LAB_003efdc3;
        lVar12 = (long)(index + 1);
        iVar11 = 0;
        iVar4 = 0;
        if (lVar8 <= lVar12) goto LAB_003eff3e;
        piVar9 = &(list->d).ptr[lVar12].size;
        iVar4 = 0;
        lVar13 = lVar12;
        goto LAB_003efe47;
      }
      lVar12 = lVar12 + 0x20;
    } while (lVar8 << 5 != lVar12);
  }
  return 0;
LAB_003efd75:
  do {
    if ((&pQVar2->empty)[lVar8] == false) {
      iVar4 = *(int *)((long)&pQVar2->maximumSize + lVar8);
      if (iVar4 == 0x7ffff) {
        if (0x7fffe < delta) {
          delta = 0x7ffff;
        }
        goto LAB_003efe84;
      }
      iVar11 = (iVar4 + iVar11) - *(int *)((long)&pQVar2->size + lVar8);
    }
    lVar8 = lVar8 + 0x20;
  } while (uVar15 * 0x20 + 0x20 != lVar8);
  if (iVar11 < delta) {
    delta = iVar11;
  }
  if (iVar11 < 1) {
LAB_003efdc3:
    iVar11 = 0;
  }
  else {
LAB_003efe84:
    lVar8 = uVar15 * 0x20 + 0x3c;
    iVar11 = 0;
    uVar10 = uVar15;
    do {
      uVar10 = uVar10 + 1;
      if ((ulong)(list->d).size <= uVar10) break;
      pQVar3 = QList<QLayoutStruct>::data(list);
      iVar4 = 0;
      if (*(char *)((long)pQVar3 + lVar8 + -7) == '\0') {
        iVar5 = *(int *)((long)pQVar3 + lVar8 + -0x10);
        iVar4 = *(int *)((long)&pQVar3->stretch + lVar8);
        iVar6 = (iVar11 - delta) + iVar4;
        if (iVar6 <= iVar5) {
          iVar6 = iVar5;
        }
        *(int *)((long)&pQVar3->stretch + lVar8) = iVar6;
        iVar4 = iVar4 - iVar6;
      }
      lVar8 = lVar8 + 0x20;
      iVar11 = iVar11 + iVar4;
    } while (iVar11 < delta);
    if (0 < iVar11) {
      uVar10 = uVar15 << 5 | 0x1c;
      iVar4 = 0;
      do {
        pQVar3 = QList<QLayoutStruct>::data(list);
        iVar5 = 0;
        if (*(char *)((long)pQVar3 + (uVar10 - 7)) == '\0') {
          iVar6 = *(int *)((long)pQVar3 + (uVar10 - 0x14));
          iVar7 = *(int *)((long)&pQVar3->stretch + uVar10);
          iVar5 = (iVar11 - iVar4) + iVar7;
          if (iVar6 <= iVar5) {
            iVar5 = iVar6;
          }
          *(int *)((long)&pQVar3->stretch + uVar10) = iVar5;
          iVar5 = iVar5 - iVar7;
        }
        iVar4 = iVar4 + iVar5;
        if (iVar11 <= iVar4) break;
        uVar10 = uVar10 - 0x20;
        bVar14 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar14);
    }
  }
  goto LAB_003efdc5;
LAB_003efe47:
  do {
    if (*(bool *)((long)piVar9 + -7) == false) {
      if (piVar9[-5] == 0x7ffff) {
        iVar4 = 0x7ffff;
        break;
      }
      iVar4 = (piVar9[-5] + iVar4) - *piVar9;
    }
    lVar13 = lVar13 + 1;
    piVar9 = piVar9 + 8;
  } while (lVar13 < lVar8);
LAB_003eff3e:
  iVar5 = -iVar4;
  if (SBORROW4(iVar4,-delta) == iVar4 + delta < 0) {
    iVar5 = delta;
  }
  if (-1 < index && iVar5 < 0) {
    uVar10 = (ulong)(uint)index << 5 | 0x1c;
    iVar4 = 0;
    uVar15 = (ulong)(uint)index;
    do {
      pQVar3 = QList<QLayoutStruct>::data(list);
      iVar11 = 0;
      if (*(char *)((long)pQVar3 + (uVar10 - 7)) == '\0') {
        iVar6 = *(int *)((long)pQVar3 + (uVar10 - 0x10));
        iVar11 = *(int *)((long)&pQVar3->stretch + uVar10);
        iVar7 = iVar4 + iVar5 + iVar11;
        if (iVar7 <= iVar6) {
          iVar7 = iVar6;
        }
        *(int *)((long)&pQVar3->stretch + uVar10) = iVar7;
        iVar11 = iVar11 - iVar7;
      }
      iVar4 = iVar4 + iVar11;
      if (SBORROW4(iVar4,-iVar5) == iVar4 + iVar5 < 0) break;
      uVar10 = uVar10 - 0x20;
      bVar14 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar14);
    iVar11 = -iVar4;
    if (0 < iVar4) {
      lVar8 = lVar12 + -1;
      uVar15 = lVar12 << 5 | 0x1c;
      iVar5 = 0;
      do {
        lVar12 = (list->d).size;
        lVar8 = lVar8 + 1;
        if (lVar12 <= lVar8) goto LAB_003efdc9;
        pQVar3 = QList<QLayoutStruct>::data(list);
        iVar6 = 0;
        if (*(char *)((long)pQVar3 + (uVar15 - 7)) == '\0') {
          iVar7 = *(int *)((long)pQVar3 + (uVar15 - 0x14));
          iVar1 = *(int *)((long)&pQVar3->stretch + uVar15);
          iVar6 = (iVar4 - iVar5) + iVar1;
          if (iVar7 <= iVar6) {
            iVar6 = iVar7;
          }
          *(int *)((long)&pQVar3->stretch + uVar15) = iVar6;
          iVar6 = iVar6 - iVar1;
        }
        uVar15 = uVar15 + 0x20;
        iVar5 = iVar5 + iVar6;
      } while (iVar5 < iVar4);
    }
  }
LAB_003efdc5:
  lVar12 = (list->d).size;
LAB_003efdc9:
  if (lVar12 != 0) {
    bVar14 = true;
    lVar8 = 0x1c;
    uVar15 = 0;
    do {
      pQVar3 = QList<QLayoutStruct>::data(list);
      iVar4 = sep;
      if (bVar14) {
        iVar4 = 0;
      }
      iVar4 = iVar4 + local_40;
      if (*(char *)((long)pQVar3 + lVar8 + -7) == '\0') {
        local_40 = *(int *)((long)&pQVar3->stretch + lVar8) + iVar4;
        bVar14 = false;
      }
      *(int *)((long)pQVar3 + lVar8 + -4) = iVar4;
      uVar15 = uVar15 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar15 < (ulong)(list->d).size);
  }
  return iVar11;
}

Assistant:

static int separatorMoveHelper(QList<QLayoutStruct> &list, int index, int delta, int sep)
{
    // adjust sizes
    int pos = -1;
    for (int i = 0; i < list.size(); ++i) {
        const QLayoutStruct &ls = list.at(i);
        if (!ls.empty) {
            pos = ls.pos;
            break;
        }
    }
    if (pos == -1)
        return 0;

    if (delta > 0) {
        int growlimit = 0;
        for (int i = 0; i<=index; ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (delta > growlimit)
            delta = growlimit;

        int d = 0;
        for (int i = index + 1; d < delta && i < list.size(); ++i)
            d += shrink(list[i], delta - d);
        delta = d;
        d = 0;
        for (int i = index; d < delta && i >= 0; --i)
            d += grow(list[i], delta - d);
    } else if (delta < 0) {
        int growlimit = 0;
        for (int i = index + 1; i < list.size(); ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (-delta > growlimit)
            delta = -growlimit;

        int d = 0;
        for (int i = index; d < -delta && i >= 0; --i)
            d += shrink(list[i], -delta - d);
        delta = -d;
        d = 0;
        for (int i = index + 1; d < -delta && i < list.size(); ++i)
            d += grow(list[i], -delta - d);
    }

    // adjust positions
    bool first = true;
    for (int i = 0; i < list.size(); ++i) {
        QLayoutStruct &ls = list[i];
        if (ls.empty) {
            ls.pos = pos + (first ? 0 : sep);
            continue;
        }
        if (!first)
            pos += sep;
        ls.pos = pos;
        pos += ls.size;
        first = false;
    }

    return delta;
}